

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.cc
# Opt level: O1

int __thiscall brown::App::runLogic(App *this)

{
  if (this->userInit != (_func_void_Simulator_ptr *)0x0) {
    (*this->userInit)(this->sim);
  }
  if (this->isBreak == false) {
    do {
      (**this->sim->_vptr_Simulator)();
      if (this->userLoop != (_func_void_Simulator_ptr *)0x0) {
        (*this->userLoop)(this->sim);
      }
    } while (this->isBreak != true);
  }
  return 0;
}

Assistant:

int App::runLogic() {
    if (userInit) {userInit(sim);}
    while (!isBreak) {
        sim.hardwareLoop();
        if (userLoop) {userLoop(sim);}
    }
    return 0;
}